

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

int __thiscall Jupiter::Timer::think(Timer *this)

{
  bool bVar1;
  uint uVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40 [2];
  int local_30;
  __unspec local_29;
  int killMe;
  type local_19;
  Timer *local_18;
  Timer *this_local;
  
  local_18 = this;
  _killMe = (duration)std::chrono::_V2::steady_clock::now();
  local_19 = (type)std::chrono::
                   operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             (&this->m_next_call,
                              (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&killMe);
  std::__cmp_cat::__unspec::__unspec(&local_29,(__unspec *)0x0);
  bVar1 = std::operator<=(local_19);
  if (bVar1) {
    local_30 = 0;
    if ((this->m_iterations != 0) &&
       (uVar2 = this->m_iterations - 1, this->m_iterations = uVar2, uVar2 == 0)) {
      local_30 = 1;
    }
    (*this->m_function)(this->m_iterations,this->m_parameters);
    local_40[0].__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    tVar3 = std::chrono::operator+(&this->m_delay,local_40);
    (this->m_next_call).__d.__r = (rep)tVar3.__d.__r;
    this_local._4_4_ = local_30;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Jupiter::Timer::think()
{
	if (m_next_call <= std::chrono::steady_clock::now())
	{
		int killMe = 0;

		if (m_iterations != 0 && --m_iterations == 0)
			killMe = 1;

		m_function(m_iterations, m_parameters);
		m_next_call = m_delay + std::chrono::steady_clock::now();

		return killMe;
	}

	return 0;
}